

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase378::run(TestCase378 *this)

{
  bool bVar1;
  unsigned_long *puVar2;
  Promise<void> *this_00;
  Range<unsigned_long> RVar3;
  PromiseNode **local_1b0;
  int local_160;
  bool local_159;
  unsigned_long uStack_158;
  bool _kj_shouldLog;
  unsigned_long i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_long> *__range2;
  Promise<void> local_120;
  Promise<void> local_110;
  Type local_100;
  Promise<void> local_f0;
  Promise<void> local_e0;
  PromiseNode **local_d0;
  undefined1 local_c8 [8];
  Promise<void> promises [6];
  int counter;
  undefined1 local_58 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase378 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval);
  WaitScope::WaitScope((WaitScope *)local_58,(EventLoop *)&waitScope.busyPollInterval);
  promises[5].super_PromiseBase.node.ptr._0_4_ = 0;
  local_d0 = (PromiseNode **)local_c8;
  Promise<void>::Promise((Promise<void> *)local_d0,(void *)0x0);
  local_d0 = &promises[0].super_PromiseBase.node.ptr;
  Promise<void>::Promise((Promise<void> *)local_d0,(void *)0x0);
  local_d0 = &promises[1].super_PromiseBase.node.ptr;
  Promise<void>::Promise((Promise<void> *)local_d0,(void *)0x0);
  local_d0 = &promises[2].super_PromiseBase.node.ptr;
  Promise<void>::Promise((Promise<void> *)local_d0,(void *)0x0);
  local_d0 = &promises[3].super_PromiseBase.node.ptr;
  Promise<void>::Promise((Promise<void> *)local_d0,(void *)0x0);
  local_d0 = &promises[4].super_PromiseBase.node.ptr;
  Promise<void>::Promise((Promise<void> *)local_d0,(void *)0x0);
  local_100.counter = (int *)&promises[5].super_PromiseBase.node.ptr;
  local_100.promises = (Promise<void> (*) [6])local_c8;
  evalLater<kj::(anonymous_namespace)::TestCase378::run()::__0>((kj *)&local_f0,&local_100);
  Promise<void>::eagerlyEvaluate(&local_e0,&local_f0);
  Promise<void>::operator=((Promise<void> *)&promises[0].super_PromiseBase.node.ptr,&local_e0);
  Promise<void>::~Promise(&local_e0);
  Promise<void>::~Promise(&local_f0);
  __range2 = (Range<unsigned_long> *)&promises[5].super_PromiseBase.node.ptr;
  evalLater<kj::(anonymous_namespace)::TestCase378::run()::__1>((kj *)&local_120,(Type *)&__range2);
  Promise<void>::eagerlyEvaluate(&local_110,&local_120);
  Promise<void>::operator=((Promise<void> *)local_c8,&local_110);
  Promise<void>::~Promise(&local_110);
  Promise<void>::~Promise(&local_120);
  RVar3 = indices<kj::Promise<void>(&)[6]>((Promise<void> (*) [6])local_c8);
  __begin2.value = RVar3.begin_;
  __end2 = Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin2);
  i = (unsigned_long)Range<unsigned_long>::end((Range<unsigned_long> *)&__begin2);
  while (bVar1 = Range<unsigned_long>::Iterator::operator!=(&__end2,(Iterator *)&i), bVar1) {
    puVar2 = Range<unsigned_long>::Iterator::operator*(&__end2);
    uStack_158 = *puVar2;
    this_00 = mv<kj::Promise<void>>
                        ((Promise<void> *)&promises[uStack_158 - 1].super_PromiseBase.node.ptr);
    Promise<void>::wait(this_00,local_58);
    Range<unsigned_long>::Iterator::operator++(&__end2);
  }
  if ((int)promises[5].super_PromiseBase.node.ptr != 7) {
    local_159 = _::Debug::shouldLog(ERROR);
    while (local_159 != false) {
      local_160 = 7;
      _::Debug::log<char_const(&)[34],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x1b0,ERROR,"\"failed: expected \" \"(7) == (counter)\", 7, counter",
                 (char (*) [34])"failed: expected (7) == (counter)",&local_160,
                 (int *)&promises[5].super_PromiseBase.node.ptr);
      local_159 = false;
    }
  }
  local_1b0 = &promises[5].super_PromiseBase.node.ptr;
  do {
    local_1b0 = local_1b0 + -2;
    Promise<void>::~Promise((Promise<void> *)local_1b0);
  } while (local_1b0 != (PromiseNode **)local_c8);
  WaitScope::~WaitScope((WaitScope *)local_58);
  EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
  return;
}

Assistant:

TEST(Async, Ordering) {
  EventLoop loop;
  WaitScope waitScope(loop);

  int counter = 0;
  Promise<void> promises[6] = {nullptr, nullptr, nullptr, nullptr, nullptr, nullptr};

  promises[1] = evalLater([&]() {
    EXPECT_EQ(0, counter++);

    {
      // Use a promise and fulfiller so that we can fulfill the promise after waiting on it in
      // order to induce depth-first scheduling.
      auto paf = kj::newPromiseAndFulfiller<void>();
      promises[2] = paf.promise.then([&]() {
        EXPECT_EQ(1, counter++);
      }).eagerlyEvaluate(nullptr);
      paf.fulfiller->fulfill();
    }

    // .then() is scheduled breadth-first if the promise has already resolved, but depth-first
    // if the promise resolves later.
    promises[3] = Promise<void>(READY_NOW).then([&]() {
      EXPECT_EQ(4, counter++);
    }).then([&]() {
      EXPECT_EQ(5, counter++);
    }).eagerlyEvaluate(nullptr);

    {
      auto paf = kj::newPromiseAndFulfiller<void>();
      promises[4] = paf.promise.then([&]() {
        EXPECT_EQ(2, counter++);
      }).eagerlyEvaluate(nullptr);
      paf.fulfiller->fulfill();
    }

    // evalLater() is like READY_NOW.then().
    promises[5] = evalLater([&]() {
      EXPECT_EQ(6, counter++);
    }).eagerlyEvaluate(nullptr);
  }).eagerlyEvaluate(nullptr);

  promises[0] = evalLater([&]() {
    EXPECT_EQ(3, counter++);

    // Making this a chain should NOT cause it to preempt promises[1].  (This was a problem at one
    // point.)
    return Promise<void>(READY_NOW);
  }).eagerlyEvaluate(nullptr);

  for (auto i: indices(promises)) {
    kj::mv(promises[i]).wait(waitScope);
  }

  EXPECT_EQ(7, counter);
}